

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  uint uVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  undefined8 uVar5;
  uint uVar6;
  U32 UVar7;
  U32 UVar8;
  size_t sVar9;
  ulong uVar10;
  int iVar11;
  BYTE *pBVar12;
  int iVar13;
  int *ip;
  int *ip_00;
  int *piVar14;
  BYTE *pBVar15;
  int *piVar16;
  int *piVar17;
  size_t sVar18;
  ulong uVar19;
  size_t sVar20;
  long lVar21;
  seqDef *psVar22;
  uint local_f0;
  uint local_ec;
  size_t offset2;
  int *local_c0;
  BYTE *local_b8;
  int *local_b0;
  size_t local_a8;
  ZSTD_matchState_t *local_a0;
  BYTE *local_98;
  int *local_90;
  int local_88;
  int local_84;
  int local_80;
  uint local_7c;
  seqStore_t *local_78;
  int *local_70;
  BYTE *local_68;
  BYTE *local_60;
  uint *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  int *local_38;
  
  pBVar3 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  local_b8 = pBVar3 + uVar2;
  local_f0 = *rep;
  pZVar4 = ms->dictMatchState;
  local_b0 = (int *)(pZVar4->window).nextSrc;
  local_98 = (pZVar4->window).base;
  local_60 = local_98 + (pZVar4->window).dictLimit;
  iVar13 = (int)local_b0;
  uVar6 = ((int)src - ((int)local_b8 + (int)local_60)) + iVar13;
  if (uVar6 < local_f0) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417a,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_ec = rep[1];
  local_58 = rep;
  if (uVar6 < local_ec) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417b,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  local_90 = (int *)((long)src + (srcSize - 8));
  local_7c = ((int)local_98 - iVar13) + uVar2;
  ip = (int *)((long)src + (ulong)(uVar6 == 0));
  local_68 = local_98 + -(ulong)local_7c;
  local_70 = iEnd + -8;
  iVar11 = (int)pBVar3;
  local_80 = (1 - uVar2) - iVar11;
  local_88 = -iVar11;
  local_84 = (((iVar13 - uVar2) - (int)local_98) - iVar11) + 1;
  local_78 = seqStore;
  do {
    while( true ) {
      if (local_90 <= ip) {
        *local_58 = local_f0;
        local_58[1] = local_ec;
        return (long)iEnd - (long)src;
      }
      iVar13 = (int)ip;
      uVar6 = ((iVar13 - iVar11) - local_f0) + 1;
      piVar17 = (int *)(pBVar3 + uVar6);
      if (uVar6 < uVar2) {
        piVar17 = (int *)(local_98 + (uVar6 - local_7c));
      }
      if ((uVar6 - uVar2 < 0xfffffffd) && (*piVar17 == *(int *)((long)ip + 1))) {
        piVar16 = iEnd;
        if (uVar6 < uVar2) {
          piVar16 = local_b0;
        }
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)((long)ip + 5),(BYTE *)(piVar17 + 1),(BYTE *)iEnd,(BYTE *)piVar16
                           ,local_b8);
        uVar19 = sVar9 + 4;
      }
      else {
        uVar19 = 0;
      }
      offset2 = 999999999;
      sVar9 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS(ms,(BYTE *)ip,(BYTE *)iEnd,&offset2);
      uVar10 = uVar19;
      if (uVar19 < sVar9) {
        uVar10 = sVar9;
      }
      if (3 < uVar10) break;
      ip = (int *)((long)ip + ((long)ip - (long)src >> 8) + 1);
    }
    piVar17 = ip;
    sVar18 = offset2;
    if (sVar9 <= uVar19) {
      piVar17 = (int *)((long)ip + 1);
      sVar18 = 0;
    }
    local_40 = (ulong)((local_80 - local_f0) + iVar13);
    local_48 = (ulong)((local_88 - local_f0) + iVar13);
    local_50 = (ulong)((local_84 - local_f0) + iVar13);
    piVar16 = ip;
    local_a0 = ms;
    for (lVar21 = 0; sVar9 = sVar18, sVar20 = uVar10, (int *)((long)ip + lVar21) < local_90;
        lVar21 = lVar21 + 1) {
      ip_00 = (int *)((long)ip + lVar21 + 1);
      iVar13 = (int)lVar21;
      uVar6 = (int)local_48 + iVar13 + 1;
      piVar14 = (int *)(pBVar3 + uVar6);
      if (uVar6 < uVar2) {
        piVar14 = (int *)(local_98 + (uint)((int)local_50 + iVar13));
      }
      local_c0 = piVar17;
      local_a8 = sVar18;
      local_38 = piVar16;
      if (((uint)((int)local_40 + iVar13) < 0xfffffffd) && (*piVar14 == *ip_00)) {
        piVar17 = iEnd;
        if (uVar6 < uVar2) {
          piVar17 = local_b0;
        }
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)((long)ip + lVar21 + 5),(BYTE *)(piVar14 + 1),(BYTE *)iEnd,
                           (BYTE *)piVar17,local_b8);
        UVar7 = ZSTD_highbit32((int)local_a8 + 1);
        if ((sVar9 < 0xfffffffffffffffc) &&
           ((int)(((int)uVar10 * 3 - UVar7) + 1) < (int)(sVar9 + 4) * 3)) {
          local_a8 = 0;
          sVar20 = sVar9 + 4;
          local_c0 = ip_00;
        }
      }
      offset2 = 999999999;
      uVar10 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                         (local_a0,(BYTE *)ip_00,(BYTE *)iEnd,&offset2);
      sVar18 = offset2;
      UVar7 = ZSTD_highbit32((int)offset2 + 1);
      UVar8 = ZSTD_highbit32((int)local_a8 + 1);
      piVar17 = local_c0;
      sVar9 = local_a8;
      seqStore = local_78;
      if ((uVar10 < 4) || ((int)((int)uVar10 * 4 - UVar7) <= (int)(((int)sVar20 * 4 - UVar8) + 4)))
      break;
      piVar16 = (int *)((long)local_38 + 1);
      piVar17 = piVar16;
    }
    ms = local_a0;
    if (sVar9 == 0) {
      UVar7 = 1;
    }
    else {
      uVar19 = (long)piVar17 + (-(long)pBVar3 - sVar9) + -0xfffffffe;
      pBVar12 = pBVar3;
      pBVar15 = local_b8;
      if ((uint)uVar19 < uVar2) {
        pBVar12 = local_68;
        pBVar15 = local_60;
      }
      pBVar12 = pBVar12 + (uVar19 & 0xffffffff);
      for (; ((src < piVar17 && (pBVar15 < pBVar12)) &&
             (*(BYTE *)((long)piVar17 + -1) == pBVar12[-1])); piVar17 = (int *)((long)piVar17 + -1))
      {
        pBVar12 = pBVar12 + -1;
        sVar20 = sVar20 + 1;
      }
      UVar7 = (int)sVar9 + 1;
      local_ec = local_f0;
      local_f0 = (int)sVar9 - 2;
    }
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_00131543:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2038,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
LAB_00131562:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203a,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar19 = (long)piVar17 - (long)src;
    pBVar15 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar15 + uVar19) {
LAB_00131505:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < piVar17) {
LAB_00131524:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203c,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_70 < piVar17) {
      local_c0 = piVar17;
      ZSTD_safecopyLiterals(pBVar15,(BYTE *)src,(BYTE *)piVar17,(BYTE *)local_70);
      piVar17 = local_c0;
LAB_0013126a:
      seqStore->lit = seqStore->lit + uVar19;
      if (0xffff < uVar19) {
        if (seqStore->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x204d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthID = 1;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar5 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar15 = *src;
      *(undefined8 *)(pBVar15 + 8) = uVar5;
      pBVar15 = seqStore->lit;
      if (0x10 < uVar19) {
        lVar21 = (long)(pBVar15 + 0x10) - ((long)src + 0x10);
        if (lVar21 < 8) {
          if (-0x10 < lVar21) {
            __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1268,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
        }
        else if (0xffffffffffffffe0 < lVar21 - 0x10U) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x1270,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar5 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar15 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar15 + 0x18) = uVar5;
        if (0x20 < (long)uVar19) {
          lVar21 = 0;
          do {
            puVar1 = (undefined8 *)((long)src + lVar21 + 0x20);
            uVar5 = puVar1[1];
            pBVar12 = pBVar15 + lVar21 + 0x20;
            *(undefined8 *)pBVar12 = *puVar1;
            *(undefined8 *)(pBVar12 + 8) = uVar5;
            puVar1 = (undefined8 *)((long)src + lVar21 + 0x30);
            uVar5 = puVar1[1];
            *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar12 + 0x18) = uVar5;
            lVar21 = lVar21 + 0x20;
          } while (pBVar12 + 0x20 < pBVar15 + uVar19);
        }
        goto LAB_0013126a;
      }
      seqStore->lit = pBVar15 + uVar19;
    }
    psVar22 = seqStore->sequences;
    psVar22->litLength = (U16)uVar19;
    psVar22->offset = UVar7;
    if (0xffff < sVar20 - 3) {
      if (seqStore->longLengthID != 0) {
LAB_00131581:
        __assert_fail("seqStorePtr->longLengthID == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2058,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthID = 2;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar22 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar22->matchLength = (U16)(sVar20 - 3);
    psVar22 = psVar22 + 1;
    seqStore->sequences = psVar22;
    uVar6 = local_ec;
    for (ip = (int *)((long)piVar17 + sVar20); local_ec = uVar6, src = ip, ip <= local_90;
        ip = (int *)((long)ip + sVar9 + 4)) {
      uVar6 = ((int)ip - iVar11) - local_ec;
      pBVar15 = pBVar3;
      if (uVar6 < uVar2) {
        pBVar15 = local_68;
      }
      if ((0xfffffffc < uVar6 - uVar2) || (*(int *)(pBVar15 + uVar6) != *ip)) break;
      piVar17 = iEnd;
      if (uVar6 < uVar2) {
        piVar17 = local_b0;
      }
      sVar9 = ZSTD_count_2segments
                        ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar15 + uVar6) + 4),(BYTE *)iEnd,
                         (BYTE *)piVar17,local_b8);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar22 - (long)seqStore->sequencesStart >> 3))
      goto LAB_00131543;
      if (0x20000 < seqStore->maxNbLit) goto LAB_00131562;
      pBVar15 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar15) goto LAB_00131505;
      if (iEnd < ip) goto LAB_00131524;
      if (local_70 < ip) {
        ZSTD_safecopyLiterals(pBVar15,(BYTE *)ip,(BYTE *)ip,(BYTE *)local_70);
      }
      else {
        uVar5 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar15 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar15 + 8) = uVar5;
      }
      psVar22 = seqStore->sequences;
      psVar22->litLength = 0;
      psVar22->offset = 1;
      if (0xffff < sVar9 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_00131581;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar22 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar22->matchLength = (U16)(sVar9 + 1);
      psVar22 = psVar22 + 1;
      seqStore->sequences = psVar22;
      uVar6 = local_f0;
      local_f0 = local_ec;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_dictMatchState);
}